

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPrivateKey.cpp
# Opt level: O1

bool __thiscall OSSLECPrivateKey::PKCS8Decode(OSSLECPrivateKey *this,ByteString *ber)

{
  size_t sVar1;
  PKCS8_PRIV_KEY_INFO *p8;
  EVP_PKEY *pkey;
  ec_key_st *key;
  uchar *priv;
  uchar *local_20;
  
  sVar1 = ByteString::size(ber);
  if (0 < (int)(uint)sVar1) {
    local_20 = ByteString::const_byte_str(ber);
    p8 = d2i_PKCS8_PRIV_KEY_INFO
                   ((PKCS8_PRIV_KEY_INFO **)0x0,&local_20,(ulong)((uint)sVar1 & 0x7fffffff));
    if (p8 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      return false;
    }
    pkey = EVP_PKCS82PKEY(p8);
    PKCS8_PRIV_KEY_INFO_free(p8);
    if (pkey != (EVP_PKEY *)0x0) {
      key = EVP_PKEY_get1_EC_KEY(pkey);
      EVP_PKEY_free(pkey);
      if (key == (ec_key_st *)0x0) {
        return key != (ec_key_st *)0x0;
      }
      (**(code **)(*(long *)&this->super_ECPrivateKey + 0x70))(this,key);
      EC_KEY_free(key);
      return true;
    }
  }
  return false;
}

Assistant:

bool OSSLECPrivateKey::PKCS8Decode(const ByteString& ber)
{
	int len = ber.size();
	if (len <= 0) return false;
	const unsigned char* priv = ber.const_byte_str();
	PKCS8_PRIV_KEY_INFO* p8 = d2i_PKCS8_PRIV_KEY_INFO(NULL, &priv, len);
	if (p8 == NULL) return false;
	EVP_PKEY* pkey = EVP_PKCS82PKEY(p8);
	PKCS8_PRIV_KEY_INFO_free(p8);
	if (pkey == NULL) return false;
	EC_KEY* key = EVP_PKEY_get1_EC_KEY(pkey);
	EVP_PKEY_free(pkey);
	if (key == NULL) return false;
	setFromOSSL(key);
	EC_KEY_free(key);
	return true;
}